

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_variance_intrin_ssse3.c
# Opt level: O2

void accumulate_block(__m128i *src,__m128i *a,__m128i *b,__m128i *m,__m128i *sum,__m128i *sum_sq)

{
  __m128i alVar1;
  __m128i alVar2;
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  int iVar9;
  int iVar10;
  undefined1 auVar11 [15];
  unkuint9 Var12;
  undefined1 auVar13 [11];
  undefined1 auVar14 [13];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  longlong lVar17;
  short sVar18;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  undefined1 auVar19 [16];
  short sVar27;
  short sVar38;
  short sVar39;
  short sVar40;
  short sVar41;
  short sVar42;
  short sVar43;
  undefined1 auVar28 [16];
  undefined1 auVar35 [16];
  short sVar44;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  
  alVar1 = *m;
  alVar2 = *a;
  auVar34._0_14_ = alVar2._0_14_;
  auVar34[0xe] = alVar2[0]._7_1_;
  auVar34[0xf] = *(undefined1 *)((long)*b + 7);
  auVar33._14_2_ = auVar34._14_2_;
  auVar33._0_13_ = alVar2._0_13_;
  auVar33[0xd] = *(undefined1 *)((long)*b + 6);
  auVar32._13_3_ = auVar33._13_3_;
  auVar32._0_12_ = alVar2._0_12_;
  auVar32[0xc] = alVar2[0]._6_1_;
  auVar31._12_4_ = auVar32._12_4_;
  auVar31._0_11_ = alVar2._0_11_;
  auVar31[0xb] = *(undefined1 *)((long)*b + 5);
  auVar30._11_5_ = auVar31._11_5_;
  auVar30._0_10_ = alVar2._0_10_;
  auVar30[10] = alVar2[0]._5_1_;
  auVar29._10_6_ = auVar30._10_6_;
  auVar29._0_9_ = alVar2._0_9_;
  auVar29[9] = *(undefined1 *)((long)*b + 4);
  auVar28._9_7_ = auVar29._9_7_;
  auVar28._0_8_ = alVar2[0];
  auVar28[8] = alVar2[0]._4_1_;
  auVar37._8_8_ = auVar28._8_8_;
  auVar37[7] = *(undefined1 *)((long)*b + 3);
  auVar37[6] = alVar2[0]._3_1_;
  auVar37[5] = *(undefined1 *)((long)*b + 2);
  auVar37[4] = alVar2[0]._2_1_;
  auVar37[3] = *(undefined1 *)((long)*b + 1);
  auVar37[2] = alVar2[0]._1_1_;
  auVar37[0] = (undefined1)alVar2[0];
  auVar37[1] = (char)(*b)[0];
  auVar54._0_14_ = alVar1._0_14_;
  auVar54[0xe] = alVar1[0]._7_1_;
  auVar54[0xf] = '@' - alVar1[0]._7_1_;
  auVar53._14_2_ = auVar54._14_2_;
  auVar53._0_13_ = alVar1._0_13_;
  auVar53[0xd] = '@' - alVar1[0]._6_1_;
  auVar52._13_3_ = auVar53._13_3_;
  auVar52._0_12_ = alVar1._0_12_;
  auVar52[0xc] = alVar1[0]._6_1_;
  auVar51._12_4_ = auVar52._12_4_;
  auVar51._0_11_ = alVar1._0_11_;
  auVar51[0xb] = '@' - alVar1[0]._5_1_;
  auVar50._11_5_ = auVar51._11_5_;
  auVar50._0_10_ = alVar1._0_10_;
  auVar50[10] = alVar1[0]._5_1_;
  auVar49._10_6_ = auVar50._10_6_;
  auVar49._0_9_ = alVar1._0_9_;
  auVar49[9] = '@' - alVar1[0]._4_1_;
  auVar48._9_7_ = auVar49._9_7_;
  auVar48._0_8_ = alVar1[0];
  auVar48[8] = alVar1[0]._4_1_;
  auVar47._8_8_ = auVar48._8_8_;
  auVar47[7] = '@' - alVar1[0]._3_1_;
  auVar47[6] = alVar1[0]._3_1_;
  auVar47[5] = '@' - alVar1[0]._2_1_;
  auVar47[4] = alVar1[0]._2_1_;
  auVar47[3] = '@' - alVar1[0]._1_1_;
  auVar47[2] = alVar1[0]._1_1_;
  auVar47[1] = '@' - (char)alVar1[0];
  auVar47[0] = (char)alVar1[0];
  auVar35 = pmaddubsw(auVar37,auVar47);
  sVar27 = pavgw(auVar35._0_2_ >> 5,0);
  sVar38 = pavgw(auVar35._2_2_ >> 5,0);
  sVar39 = pavgw(auVar35._4_2_ >> 5,0);
  sVar40 = pavgw(auVar35._6_2_ >> 5,0);
  sVar41 = pavgw(auVar35._8_2_ >> 5,0);
  sVar42 = pavgw(auVar35._10_2_ >> 5,0);
  sVar43 = pavgw(auVar35._12_2_ >> 5,0);
  sVar44 = pavgw(auVar35._14_2_ >> 5,0);
  auVar35[1] = (char)(*b)[1];
  auVar35[0] = (char)alVar2[1];
  auVar35[2] = alVar2[1]._1_1_;
  auVar35[3] = *(undefined1 *)((long)*b + 9);
  auVar35[4] = alVar2[1]._2_1_;
  auVar35[5] = *(undefined1 *)((long)*b + 10);
  auVar35[6] = alVar2[1]._3_1_;
  auVar35[7] = *(undefined1 *)((long)*b + 0xb);
  auVar35[8] = alVar2[1]._4_1_;
  auVar35[9] = *(undefined1 *)((long)*b + 0xc);
  auVar35[10] = alVar2[1]._5_1_;
  auVar35[0xb] = *(undefined1 *)((long)*b + 0xd);
  auVar35[0xc] = alVar2[1]._6_1_;
  auVar35[0xd] = *(undefined1 *)((long)*b + 0xe);
  auVar35[0xe] = alVar2[1]._7_1_;
  auVar35[0xf] = *(undefined1 *)((long)*b + 0xf);
  auVar45[1] = '@' - (char)alVar1[1];
  auVar45[0] = (char)alVar1[1];
  auVar45[2] = alVar1[1]._1_1_;
  auVar45[3] = '@' - alVar1[1]._1_1_;
  auVar45[4] = alVar1[1]._2_1_;
  auVar45[5] = '@' - alVar1[1]._2_1_;
  auVar45[6] = alVar1[1]._3_1_;
  auVar45[7] = '@' - alVar1[1]._3_1_;
  auVar45[8] = alVar1[1]._4_1_;
  auVar45[9] = '@' - alVar1[1]._4_1_;
  auVar45[10] = alVar1[1]._5_1_;
  auVar45[0xb] = '@' - alVar1[1]._5_1_;
  auVar45[0xc] = alVar1[1]._6_1_;
  auVar45[0xd] = '@' - alVar1[1]._6_1_;
  auVar45[0xe] = alVar1[1]._7_1_;
  auVar45[0xf] = '@' - alVar1[1]._7_1_;
  auVar35 = pmaddubsw(auVar35,auVar45);
  sVar18 = pavgw(auVar35._0_2_ >> 5,0);
  sVar20 = pavgw(auVar35._2_2_ >> 5,0);
  sVar21 = pavgw(auVar35._4_2_ >> 5,0);
  sVar22 = pavgw(auVar35._6_2_ >> 5,0);
  sVar23 = pavgw(auVar35._8_2_ >> 5,0);
  sVar24 = pavgw(auVar35._10_2_ >> 5,0);
  sVar25 = pavgw(auVar35._12_2_ >> 5,0);
  sVar26 = pavgw(auVar35._14_2_ >> 5,0);
  alVar1 = *src;
  auVar3[0xd] = 0;
  auVar3._0_13_ = alVar1._0_13_;
  auVar3[0xe] = alVar1[0]._7_1_;
  auVar4[0xc] = alVar1[0]._6_1_;
  auVar4._0_12_ = alVar1._0_12_;
  auVar4._13_2_ = auVar3._13_2_;
  auVar5[0xb] = 0;
  auVar5._0_11_ = alVar1._0_11_;
  auVar5._12_3_ = auVar4._12_3_;
  auVar6[10] = alVar1[0]._5_1_;
  auVar6._0_10_ = alVar1._0_10_;
  auVar6._11_4_ = auVar5._11_4_;
  auVar7[9] = 0;
  auVar7._0_9_ = alVar1._0_9_;
  auVar7._10_5_ = auVar6._10_5_;
  auVar8[8] = alVar1[0]._4_1_;
  auVar8._0_8_ = alVar1[0];
  auVar8._9_6_ = auVar7._9_6_;
  auVar11._7_8_ = 0;
  auVar11._0_7_ = auVar8._8_7_;
  Var12 = CONCAT81(SUB158(auVar11 << 0x40,7),alVar1[0]._3_1_);
  auVar15._9_6_ = 0;
  auVar15._0_9_ = Var12;
  auVar13._1_10_ = SUB1510(auVar15 << 0x30,5);
  auVar13[0] = alVar1[0]._2_1_;
  auVar16._11_4_ = 0;
  auVar16._0_11_ = auVar13;
  auVar14._1_12_ = SUB1512(auVar16 << 0x20,3);
  auVar14[0] = alVar1[0]._1_1_;
  auVar36._0_2_ = sVar27 - (ushort)(byte)alVar1[0];
  auVar36._2_2_ = sVar38 - auVar14._0_2_;
  auVar36._4_2_ = sVar39 - auVar13._0_2_;
  auVar36._6_2_ = sVar40 - (short)Var12;
  auVar36._8_2_ = sVar41 - auVar8._8_2_;
  auVar36._10_2_ = sVar42 - auVar6._10_2_;
  auVar36._12_2_ = sVar43 - auVar4._12_2_;
  auVar36._14_2_ = sVar44 - (auVar3._13_2_ >> 8);
  auVar19._0_2_ = sVar18 - (ushort)(byte)alVar1[1];
  auVar19._2_2_ = sVar20 - (ushort)alVar1[1]._1_1_;
  auVar19._4_2_ = sVar21 - (ushort)alVar1[1]._2_1_;
  auVar19._6_2_ = sVar22 - (ushort)alVar1[1]._3_1_;
  auVar19._8_2_ = sVar23 - (ushort)alVar1[1]._4_1_;
  auVar19._10_2_ = sVar24 - (ushort)alVar1[1]._5_1_;
  auVar19._12_2_ = sVar25 - (ushort)alVar1[1]._6_1_;
  auVar19._14_2_ = sVar26 - (ushort)alVar1[1]._7_1_;
  auVar46._0_2_ = auVar36._0_2_ + auVar19._0_2_;
  auVar46._2_2_ = auVar36._2_2_ + auVar19._2_2_;
  auVar46._4_2_ = auVar36._4_2_ + auVar19._4_2_;
  auVar46._6_2_ = auVar36._6_2_ + auVar19._6_2_;
  auVar46._8_2_ = auVar36._8_2_ + auVar19._8_2_;
  auVar46._10_2_ = auVar36._10_2_ + auVar19._10_2_;
  auVar46._12_2_ = auVar36._12_2_ + auVar19._12_2_;
  auVar46._14_2_ = auVar36._14_2_ + auVar19._14_2_;
  auVar35 = pmaddwd(auVar46,_DAT_0046e8b0);
  iVar9 = *(int *)((long)*sum + 4);
  lVar17 = (*sum)[1];
  iVar10 = *(int *)((long)*sum + 0xc);
  *(int *)*sum = auVar35._0_4_ + (int)(*sum)[0];
  *(int *)((long)*sum + 4) = auVar35._4_4_ + iVar9;
  *(int *)(*sum + 1) = auVar35._8_4_ + (int)lVar17;
  *(int *)((long)*sum + 0xc) = auVar35._12_4_ + iVar10;
  auVar37 = pmaddwd(auVar36,auVar36);
  auVar35 = pmaddwd(auVar19,auVar19);
  iVar9 = *(int *)((long)*sum_sq + 4);
  lVar17 = (*sum_sq)[1];
  iVar10 = *(int *)((long)*sum_sq + 0xc);
  *(int *)*sum_sq = auVar37._0_4_ + (int)(*sum_sq)[0] + auVar35._0_4_;
  *(int *)((long)*sum_sq + 4) = auVar37._4_4_ + iVar9 + auVar35._4_4_;
  *(int *)(*sum_sq + 1) = auVar37._8_4_ + (int)lVar17 + auVar35._8_4_;
  *(int *)((long)*sum_sq + 0xc) = auVar37._12_4_ + iVar10 + auVar35._12_4_;
  return;
}

Assistant:

static inline void accumulate_block(const __m128i *src, const __m128i *a,
                                    const __m128i *b, const __m128i *m,
                                    __m128i *sum, __m128i *sum_sq) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i one = _mm_set1_epi16(1);
  const __m128i mask_max = _mm_set1_epi8((1 << AOM_BLEND_A64_ROUND_BITS));
  const __m128i m_inv = _mm_sub_epi8(mask_max, *m);

  // Calculate 16 predicted pixels.
  // Note that the maximum value of any entry of 'pred_l' or 'pred_r'
  // is 64 * 255, so we have plenty of space to add rounding constants.
  const __m128i data_l = _mm_unpacklo_epi8(*a, *b);
  const __m128i mask_l = _mm_unpacklo_epi8(*m, m_inv);
  __m128i pred_l = _mm_maddubs_epi16(data_l, mask_l);
  pred_l = xx_roundn_epu16(pred_l, AOM_BLEND_A64_ROUND_BITS);

  const __m128i data_r = _mm_unpackhi_epi8(*a, *b);
  const __m128i mask_r = _mm_unpackhi_epi8(*m, m_inv);
  __m128i pred_r = _mm_maddubs_epi16(data_r, mask_r);
  pred_r = xx_roundn_epu16(pred_r, AOM_BLEND_A64_ROUND_BITS);

  const __m128i src_l = _mm_unpacklo_epi8(*src, zero);
  const __m128i src_r = _mm_unpackhi_epi8(*src, zero);
  const __m128i diff_l = _mm_sub_epi16(pred_l, src_l);
  const __m128i diff_r = _mm_sub_epi16(pred_r, src_r);

  // Update partial sums and partial sums of squares
  *sum =
      _mm_add_epi32(*sum, _mm_madd_epi16(_mm_add_epi16(diff_l, diff_r), one));
  *sum_sq =
      _mm_add_epi32(*sum_sq, _mm_add_epi32(_mm_madd_epi16(diff_l, diff_l),
                                           _mm_madd_epi16(diff_r, diff_r)));
}